

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformations.c
# Opt level: O1

void al_rotate_transform_3d(ALLEGRO_TRANSFORM *trans,float x,float y,float z,float angle)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ALLEGRO_TRANSFORM local_48;
  
  dVar1 = sin((double)angle);
  dVar2 = cos((double)angle);
  dVar3 = 1.0 - dVar2;
  local_48.m[2][3] = 0.0;
  local_48.m[3][0] = 0.0;
  local_48.m[3][1] = 0.0;
  local_48.m[3][2] = 0.0;
  local_48.m[3][3] = 1.0;
  dVar6 = (double)x;
  dVar7 = (double)y;
  dVar4 = (double)z;
  dVar5 = dVar3 * dVar6;
  local_48.m[0][3] = 0.0;
  local_48.m[0][0] = (float)(dVar5 * dVar6 + dVar2);
  local_48.m[0][1] = (float)(dVar5 * dVar7 + dVar1 * dVar4);
  local_48.m[0][2] = (float)(dVar5 * dVar4 - dVar1 * dVar7);
  local_48.m[1][0] = (float)(dVar5 * dVar7 + -(dVar1 * dVar4));
  local_48.m[1][1] = (float)(dVar3 * dVar7 * dVar7 + dVar2);
  local_48.m[1][3] = 0.0;
  local_48.m[1][2] = (float)(dVar7 * dVar3 * dVar4 + dVar1 * dVar6);
  local_48.m[2][1] = (float)(dVar4 * dVar3 * dVar7 + -(dVar1 * dVar6));
  local_48.m[2][0] = (float)(dVar4 * dVar5 + dVar1 * dVar7);
  local_48.m[2][2] = (float)(dVar3 * dVar4 * dVar4 + dVar2);
  al_compose_transform(trans,&local_48);
  return;
}

Assistant:

void al_rotate_transform_3d(ALLEGRO_TRANSFORM *trans,
   float x, float y, float z, float angle)
{
   double s = sin(angle);
   double c = cos(angle);
   double cc = 1 - c;
   ALLEGRO_TRANSFORM tmp;

   al_identity_transform(&tmp);

   tmp.m[0][0] = (cc * x * x) + c;
   tmp.m[0][1] = (cc * x * y) + (z * s);
   tmp.m[0][2] = (cc * x * z) - (y * s);
   tmp.m[0][3] = 0;

   tmp.m[1][0] = (cc * x * y) - (z * s);
   tmp.m[1][1] = (cc * y * y) + c;
   tmp.m[1][2] = (cc * z * y) + (x * s);
   tmp.m[1][3] = 0;

   tmp.m[2][0] = (cc * x * z) + (y * s);
   tmp.m[2][1] = (cc * y * z) - (x * s);
   tmp.m[2][2] = (cc * z * z) + c;
   tmp.m[2][3] = 0;

   tmp.m[3][0] = 0;
   tmp.m[3][1] = 0;
   tmp.m[3][2] = 0;
   tmp.m[3][3] = 1;

   al_compose_transform(trans, &tmp);
}